

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

void __thiscall irr::video::CNullDriver::removeAllRenderTargets(CNullDriver *this)

{
  u32 uVar1;
  long in_RDI;
  u32 i;
  undefined4 in_stack_ffffffffffffffd8;
  u32 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar2;
  uint uVar3;
  
  uVar2 = 0;
  while( true ) {
    uVar3 = uVar2;
    uVar1 = core::array<irr::video::IRenderTarget_*>::size
                      ((array<irr::video::IRenderTarget_*> *)0x30cdf1);
    if (uVar1 <= uVar2) break;
    core::array<irr::video::IRenderTarget_*>::operator[]
              ((array<irr::video::IRenderTarget_*> *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc);
    IReferenceCounted::drop
              ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    uVar2 = uVar3 + 1;
  }
  core::array<irr::video::IRenderTarget_*>::clear
            ((array<irr::video::IRenderTarget_*> *)CONCAT44(uVar3,in_stack_fffffffffffffff0));
  *(undefined8 *)(in_RDI + 0x70) = 0;
  return;
}

Assistant:

void CNullDriver::removeAllRenderTargets()
{
	for (u32 i = 0; i < RenderTargets.size(); ++i)
		RenderTargets[i]->drop();

	RenderTargets.clear();

	SharedRenderTarget = 0;
}